

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_utils.cpp
# Opt level: O1

string * PEGetPDBPath_abi_cxx11_(string *__return_storage_ptr__,void *data,size_t size)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  char *__s;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  
  if ((((0x3f < size) && (*data == 0x5a4d)) &&
      (*(int *)((long)data + (long)*(int *)((long)data + 0x3c)) == 0x4550)) &&
     (lVar7 = (long)*(int *)((long)data + 0x3c), *(int *)((long)data + lVar7 + 0xbc) != 0)) {
    uVar1 = *(ushort *)((long)data + lVar7 + 6);
    if (uVar1 != 0) {
      lVar9 = (long)data + (ulong)*(ushort *)((long)data + lVar7 + 0x14) + lVar7 + 0x18;
      uVar2 = *(uint *)((long)data + lVar7 + 0xb8);
      uVar11 = 0;
      do {
        uVar3 = *(uint *)(lVar9 + 0xc);
        if (((uVar3 <= uVar2) &&
            (uVar4 = *(uint *)((long)data + lVar7 + 0xbc),
            uVar4 + uVar2 <= *(int *)(lVar9 + 0x10) + uVar3)) && (0x1b < uVar4)) {
          lVar6 = (ulong)*(uint *)(lVar9 + 0x14) - (ulong)uVar3;
          lVar5 = ((ulong)*(uint *)(lVar9 + 0x14) - (ulong)uVar3) + (ulong)uVar2 + 0x14;
          lVar13 = 0;
          do {
            if ((*(int *)((long)data + lVar13 + lVar5 + -8) == 2) &&
               (uVar12 = (ulong)*(uint *)((long)data + lVar13 + lVar5),
               *(int *)((long)data + uVar12 + lVar6) == 0x53445352)) {
              lVar6 = uVar12 + lVar6;
              __s = (char *)((long)data + lVar6 + 0x18);
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              sVar8 = strlen(__s);
              pcVar10 = (char *)((long)data + sVar8 + lVar6 + 0x18);
              goto LAB_0010e014;
            }
            lVar13 = lVar13 + 0x1c;
          } while (((ulong)(uVar4 >> 2) / 7) * 0x1c != lVar13);
        }
        uVar11 = uVar11 + 1;
        lVar9 = lVar9 + 0x28;
      } while (uVar11 != uVar1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar10 = "";
  __s = "";
LAB_0010e014:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar10);
  return __return_storage_ptr__;
}

Assistant:

std::string PEGetPDBPath(const void* data, size_t size)
{
    if (!PEIsValidFile(data, size))
        return "";

    const PE_IMAGE_DOS_HEADER* dosHeader = (const PE_IMAGE_DOS_HEADER*)data;
    const PE_IMAGE_NT_HEADERS* ntHeader = (PE_IMAGE_NT_HEADERS*)((const uint8_t*)data + dosHeader->ntHeader);

    const PE_IMAGE_DATA_DIRECTORY& debugDir = ntHeader->OptionalHeader.DataDirectory[IMAGE_DIRECTORY_ENTRY_DEBUG];
    if (debugDir.size == 0)
        return "";

    // find which section that is in
    const PE_IMAGE_SECTION_HEADER* section = IMAGE_FIRST_SECTION_IMPL(ntHeader);
    for (int i = 0; i < ntHeader->FileHeader.numberOfSections; ++i, ++section)
    {
        if ((debugDir.va < section->VirtualAddress) || (debugDir.va + debugDir.size > section->VirtualAddress + section->SizeOfRawData))
            continue; // not in this section

        const char* sectionBasePtr = (const char*)data + section->PointerToRawData - section->VirtualAddress;
        const PE_IMAGE_DEBUG_DIRECTORY* entries = (PE_IMAGE_DEBUG_DIRECTORY*)(sectionBasePtr + debugDir.va);
        size_t entryCount = debugDir.size / sizeof(PE_IMAGE_DEBUG_DIRECTORY);
        for (int ei = 0; ei < entryCount; ++ei)
        {
            if (entries[ei].Type == PE_IMAGE_DEBUG_TYPE_CODEVIEW)
            {
                const PE_DEBUGTYPE_CODEVIEW* info = (const PE_DEBUGTYPE_CODEVIEW*)(sectionBasePtr + entries[ei].AddressOfRawData);
                if (memcmp(&info->Signature, "RSDS", 4) == 0)
                {
                    return info->PdbFileName;
                }
            }
        }
    }

    return "";
}